

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall
AssignmentNode::AssignmentNode
          (AssignmentNode *this,string *name,AssignmentOperator *operation,
          unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *value)

{
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *in_RCX;
  undefined4 *in_RDX;
  string *in_RSI;
  StatementNode *in_RDI;
  
  StatementNode::StatementNode(in_RDI);
  (in_RDI->super_Node)._vptr_Node = (_func_int **)&PTR__AssignmentNode_001ae988;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined4 *)&in_RDI[3].super_Node._vptr_Node = *in_RDX;
  std::shared_ptr<ExpressionNode>::
  shared_ptr<ExpressionNode,std::default_delete<ExpressionNode>,void>
            ((shared_ptr<ExpressionNode> *)in_RDI,in_RCX);
  return;
}

Assistant:

AssignmentNode(const std::string& name, 
    const AssignmentOperator& operation, std::unique_ptr<ExpressionNode> value):
      name_(name), operator_(operation), value_(std::move(value)) {}